

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

State * __thiscall despot::Chain::CreateStartState(Chain *this,string *type)

{
  bool bVar1;
  State *pSVar2;
  ostream *poVar3;
  State *start;
  string *type_local;
  Chain *this_local;
  
  bVar1 = std::operator==(type,"DEFAULT");
  if (bVar1) {
    pSVar2 = DefaultStartState(this);
    return pSVar2;
  }
  bVar1 = std::operator==(type,"FULL");
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported initial belief type: ");
    poVar3 = std::operator<<(poVar3,(string *)type);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Initial belief type to be supported: ");
  poVar3 = std::operator<<(poVar3,(string *)type);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

State* Chain::CreateStartState(string type) const {
	State* start = NULL;
	if (type == "DEFAULT") {
		start = DefaultStartState();
	} else if (type == "FULL") {
		cerr << "Initial belief type to be supported: " << type << endl;
		exit(0);
		//return ExactPrior(NULL)->Sample(1)[0];
	} else {
		cerr << "Unsupported initial belief type: " << type << endl;
		exit(0);
	}
	return start;
}